

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v6::internal::bigint::square(bigint *this)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint *puVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  bool bVar12;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> n;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> local_d0;
  
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::basic_memory_buffer
            (&local_d0,&this->bigits_);
  uVar2 = (uint)(this->bigits_).super_buffer<unsigned_int>.size_;
  uVar10 = (ulong)(int)(uVar2 * 2);
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar10) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar10);
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar10;
  if ((int)uVar2 < 1) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar8 = 0;
    uVar3 = 0;
    uVar4 = 0;
    puVar6 = local_d0.super_buffer<unsigned_int>.ptr_;
    uVar5 = uVar8;
    do {
      do {
        bVar12 = CARRY8(uVar3,(ulong)local_d0.super_buffer<unsigned_int>.ptr_[uVar8] *
                              (ulong)*puVar6);
        uVar3 = uVar3 + (ulong)local_d0.super_buffer<unsigned_int>.ptr_[uVar8] * (ulong)*puVar6;
        uVar4 = uVar4 + bVar12;
        bVar12 = uVar8 != 0;
        uVar8 = uVar8 - 1;
        puVar6 = puVar6 + 1;
      } while (bVar12);
      puVar1[uVar5] = (uint)uVar3;
      uVar3 = uVar3 >> 0x20 | uVar4 << 0x20;
      uVar4 = uVar4 >> 0x20;
      uVar8 = uVar5 + 1;
      puVar6 = local_d0.super_buffer<unsigned_int>.ptr_;
      uVar5 = uVar8;
    } while (uVar8 != (uVar2 & 0x7fffffff));
  }
  if ((int)uVar2 < (int)(uVar2 * 2)) {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar8 = (ulong)(int)uVar2;
    iVar11 = -uVar2;
    iVar7 = 1;
    uVar5 = uVar8;
    do {
      if ((long)uVar5 < (long)((long)(int)(uVar2 - 1) + uVar8)) {
        puVar6 = local_d0.super_buffer<unsigned_int>.ptr_ + iVar7;
        lVar9 = -1;
        do {
          bVar12 = CARRY8(uVar3,(ulong)local_d0.super_buffer<unsigned_int>.ptr_[uVar8 + lVar9] *
                                (ulong)*puVar6);
          uVar3 = uVar3 + (ulong)local_d0.super_buffer<unsigned_int>.ptr_[uVar8 + lVar9] *
                          (ulong)*puVar6;
          uVar4 = uVar4 + bVar12;
          lVar9 = lVar9 + -1;
          puVar6 = puVar6 + 1;
        } while (iVar11 != (int)lVar9);
      }
      puVar1[uVar5] = (uint)uVar3;
      uVar3 = uVar3 >> 0x20 | uVar4 << 0x20;
      uVar4 = uVar4 >> 0x20;
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + 1;
      iVar11 = iVar11 + 1;
    } while (uVar5 != uVar10);
  }
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  local_d0.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_001cabc8;
  if (local_d0.super_buffer<unsigned_int>.ptr_ != local_d0.store_) {
    operator_delete(local_d0.super_buffer<unsigned_int>.ptr_,
                    local_d0.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

void square() {
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    bigits_.resize(num_result_bigits);
    using accumulator_t = conditional_t<FMT_USE_INT128, uint128_t, accumulator>;
    auto sum = accumulator_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += static_cast<double_bigit>(n[i]) * n[j];
      }
      bigits_[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += static_cast<double_bigit>(n[i++]) * n[j--];
      bigits_[bigit_index] = static_cast<bigit>(sum);
      sum >>= bits<bigit>::value;
    }
    --num_result_bigits;
    remove_leading_zeros();
    exp_ *= 2;
  }